

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall
HFactor::ftranCall(HFactor *this,vector<double,_std::allocator<double>_> *vector,
                  HighsTimerClock *factor_timer_clock_pointer)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  
  if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
    HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                      (factor_timer_clock_pointer->clock_).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[5]);
    HVectorBase<double>::clearScalars(&this->rhs_);
    pvVar1 = &(this->rhs_).array;
    std::vector<double,_std::allocator<double>_>::_M_move_assign(pvVar1,vector);
    (this->rhs_).count = -1;
    ftranCall(this,&this->rhs_,1.0,factor_timer_clock_pointer);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(vector,pvVar1);
    HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                     (factor_timer_clock_pointer->clock_).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[5]);
    return;
  }
  HVectorBase<double>::clearScalars(&this->rhs_);
  pvVar1 = &(this->rhs_).array;
  std::vector<double,_std::allocator<double>_>::_M_move_assign(pvVar1,vector);
  (this->rhs_).count = -1;
  ftranCall(this,&this->rhs_,1.0,(HighsTimerClock *)0x0);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(vector,pvVar1);
  return;
}

Assistant:

void HFactor::ftranCall(std::vector<double>& vector,
                        HighsTimerClock* factor_timer_clock_pointer) {
  FactorTimer factor_timer;
  factor_timer.start(FactorFtran, factor_timer_clock_pointer);
  // Only have to clear the scalars of the local HVector, since the
  // array is moved in. Set the count to -1 to indicate that indices
  // aren't known.
  this->rhs_.clearScalars();
  this->rhs_.array = std::move(vector);
  this->rhs_.count = -1;
  const double expected_density = 1;
  ftranCall(this->rhs_, expected_density, factor_timer_clock_pointer);
  vector = std::move(this->rhs_.array);
  factor_timer.stop(FactorFtran, factor_timer_clock_pointer);
}